

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O1

void google::DumpStackTrace(int skip_count,DebugWriter *writerfn,void *arg)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  long **pplVar4;
  ulong uVar5;
  undefined4 in_register_0000003c;
  long **__s;
  void *stack [32];
  char tmp [1024];
  char buf [1024];
  long local_938 [32];
  long *local_838;
  undefined8 local_830;
  uint local_828;
  long *local_438 [129];
  
  uVar3 = 0;
  if (ready_to_run == '\x01') {
    local_838 = local_938;
    local_830 = 0x300000020;
    local_828 = 0;
    _Unwind_Backtrace(GetOneFrame,&local_838);
    uVar3 = local_828;
  }
  if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      __s = &local_838;
      lVar1 = local_938[uVar5];
      if (fLB::FLAGS_symbolize_stacktrace == '\x01') {
        bVar2 = Symbolize((void *)(lVar1 + -1),(char *)__s,0x400);
        pplVar4 = (long **)"(unknown)";
        if (bVar2) {
          pplVar4 = __s;
        }
        __s = local_438;
        snprintf((char *)__s,0x400,"%s@ %*p  %s\n","    ",0x12,lVar1,pplVar4);
      }
      else {
        snprintf((char *)__s,100,"%s@ %*p\n","    ",0x12,lVar1);
      }
      (*(code *)CONCAT44(in_register_0000003c,skip_count))(__s,writerfn);
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

static void DumpStackTrace(int skip_count, DebugWriter *writerfn, void *arg) {
  // Print stack trace
  void* stack[32];
  int depth = GetStackTrace(stack, ARRAYSIZE(stack), skip_count+1);
  for (int i = 0; i < depth; i++) {
#if defined(HAVE_SYMBOLIZE)
    if (FLAGS_symbolize_stacktrace) {
      DumpPCAndSymbol(writerfn, arg, stack[i], "    ");
    } else {
      DumpPC(writerfn, arg, stack[i], "    ");
    }
#else
    DumpPC(writerfn, arg, stack[i], "    ");
#endif
  }
}